

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utstring.h
# Opt level: O1

void utstring_printf(UT_string *s,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar4;
  size_t sVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  va_list cp;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
LAB_00109b6c:
  do {
    local_f8 = 0x3000000010;
    local_f0 = &ap[0].overflow_arg_area;
    local_e8 = local_d8;
    uVar1 = vsnprintf(s->d + s->i,s->n - s->i,"error in %s line %d ",&local_f8);
    sVar5 = s->n;
    uVar2 = sVar5 - s->i;
    if ((int)uVar1 < 0) goto LAB_00109be1;
    if ((int)uVar1 < (int)uVar2) {
      s->i = s->i + (ulong)uVar1;
      return;
    }
    uVar4 = (ulong)(uVar1 + 1);
  } while (uVar4 <= uVar2);
  pcVar3 = (char *)realloc(s->d,sVar5 + uVar4);
  s->d = pcVar3;
  if (pcVar3 == (char *)0x0) goto LAB_00109c28;
  sVar5 = uVar4 + s->n;
  goto LAB_00109c06;
LAB_00109be1:
  if (uVar2 < sVar5 * 2) {
    pcVar3 = (char *)realloc(s->d,sVar5 * 3);
    s->d = pcVar3;
    if (pcVar3 == (char *)0x0) {
LAB_00109c28:
      exit(-1);
    }
    sVar5 = s->n * 3;
LAB_00109c06:
    s->n = sVar5;
  }
  goto LAB_00109b6c;
}

Assistant:

_UNUSED_ static void utstring_printf(UT_string *s, const char *fmt, ...) {
   va_list ap;
   va_start(ap,fmt);
   utstring_printf_va(s,fmt,ap);
   va_end(ap);
}